

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_test_result.hpp
# Opt level: O3

void __thiscall
hayai::TestResult::TestResult
          (TestResult *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *runTimes,
          size_t iterations)

{
  unsigned_long uVar1;
  pointer puVar2;
  ulong uVar3;
  long lVar4;
  pointer puVar5;
  ulong uVar6;
  uint64_t uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sortedRunTimes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->_runTimes,runTimes);
  this->_iterations = iterations;
  this->_timeTotal = 0;
  this->_timeRunMin = 0xffffffffffffffff;
  this->_timeRunMax = 0;
  this->_timeStdDev = 0.0;
  this->_timeMedian = 0.0;
  this->_timeQuartile1 = 0.0;
  this->_timeQuartile3 = 0.0;
  puVar5 = (this->_runTimes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->_runTimes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 == puVar2) {
    lVar8 = (long)puVar2 - (long)puVar5 >> 3;
    dVar11 = 0.0;
  }
  else {
    uVar9 = 0xffffffffffffffff;
    lVar8 = 0;
    uVar7 = 0;
    uVar10 = 0;
    do {
      uVar6 = *(ulong *)((long)puVar5 + lVar8);
      uVar7 = uVar7 + uVar6;
      this->_timeTotal = uVar7;
      if (lVar8 == 0) {
        this->_timeRunMax = uVar6;
        uVar10 = uVar6;
LAB_0013adcc:
        this->_timeRunMin = uVar6;
        uVar9 = uVar6;
      }
      else {
        if (uVar10 < uVar6) {
          this->_timeRunMax = uVar6;
          uVar10 = uVar6;
        }
        if (uVar6 < uVar9) goto LAB_0013adcc;
      }
      lVar4 = lVar8 + 8;
      lVar8 = lVar8 + 8;
    } while ((pointer)((long)puVar5 + lVar4) != puVar2);
    lVar8 = (long)puVar2 - (long)puVar5 >> 3;
    if (puVar2 == puVar5) {
      dVar11 = 0.0;
    }
    else {
      auVar13._8_4_ = (int)(uVar7 >> 0x20);
      auVar13._0_8_ = uVar7;
      auVar13._12_4_ = 0x45300000;
      auVar14._8_4_ = (int)((long)puVar2 - (long)puVar5 >> 0x23);
      auVar14._0_8_ = lVar8;
      auVar14._12_4_ = 0x45300000;
      dVar11 = 0.0;
      do {
        uVar1 = *puVar5;
        auVar18._8_4_ = (int)(uVar1 >> 0x20);
        auVar18._0_8_ = uVar1;
        auVar18._12_4_ = 0x45300000;
        dVar19 = ((auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) -
                 ((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) /
                 ((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0));
        dVar11 = dVar11 + dVar19 * dVar19;
        puVar5 = puVar5 + 1;
      } while (puVar5 != puVar2);
    }
  }
  lVar8 = lVar8 + -1;
  auVar15._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar15._0_8_ = lVar8;
  auVar15._12_4_ = 0x45300000;
  dVar11 = dVar11 / ((auVar15._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0));
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  this->_timeStdDev = dVar11;
  inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_30,&this->_runTimes);
  puVar2 = local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar9 = (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start >> 3;
    lVar8 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar5,puVar2);
    puVar5 = local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  uVar10 = (long)puVar5 -
           (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  uVar9 = (long)uVar10 >> 3;
  if (uVar9 < 2) {
    if (uVar10 != 8) {
      if (local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        return;
      }
      goto LAB_0013b0b9;
    }
    auVar16._0_8_ =
         (double)CONCAT44(0x43300000,
                          (int)*local_30.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    auVar16._8_4_ =
         (int)(*local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 0x20);
    auVar16._12_4_ = 0x45300000;
    dVar19 = auVar16._8_8_ - 1.9342813113834067e+25;
    dVar11 = dVar19 + (auVar16._0_8_ - 4503599627370496.0);
    dVar19 = dVar19 + (auVar16._0_8_ - 4503599627370496.0);
  }
  else {
    uVar6 = uVar9 >> 1;
    uVar9 = uVar9 >> 2;
    if ((uVar10 & 8) == 0) {
      uVar10 = local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6 - 1];
      uVar3 = (local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar6 - 1))[1];
      dVar12 = (((double)(uVar3 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                (double)(uVar3 & 0xffffffff | 0x4330000000000000) +
               ((double)(uVar10 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
               (double)(uVar10 & 0xffffffff | 0x4330000000000000)) * 0.5;
      dVar11 = ((double)(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar9] >> 0x20 |
                        0x4530000000000000) - 1.9342813118337666e+25) +
               (double)(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar9] & 0xffffffff |
                       0x4330000000000000);
      dVar19 = ((double)(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar6 + uVar9] >> 0x20 |
                        0x4530000000000000) - 1.9342813118337666e+25) +
               (double)(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar6 + uVar9] & 0xffffffff |
                       0x4330000000000000);
    }
    else {
      auVar17._0_8_ =
           (double)CONCAT44(0x43300000,
                            (int)local_30.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar6]);
      auVar17._8_4_ =
           (int)(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar6] >> 0x20);
      auVar17._12_4_ = 0x45300000;
      dVar12 = (auVar17._8_8_ - 1.9342813113834067e+25) + (auVar17._0_8_ - 4503599627370496.0);
      dVar11 = (((double)(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar9] >> 0x20 |
                         0x4530000000000000) - 1.9342813118337666e+25) +
                (double)(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar9] & 0xffffffff |
                        0x4330000000000000) +
               ((double)(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar9 - 1] >> 0x20 |
                        0x4530000000000000) - 1.9342813118337666e+25) +
               (double)(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar9 - 1] & 0xffffffff |
                       0x4330000000000000)) * 0.5;
      dVar19 = (((double)(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar6 + uVar9] >> 0x20 |
                         0x4530000000000000) - 1.9342813118337666e+25) +
                (double)(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar6 + uVar9] & 0xffffffff |
                        0x4330000000000000) +
               ((double)(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar9 + uVar6 + -1] >> 0x20 |
                        0x4530000000000000) - 1.9342813118337666e+25) +
               (double)(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar9 + uVar6 + -1] & 0xffffffff |
                       0x4330000000000000)) * 0.5;
    }
    this->_timeMedian = dVar12;
  }
  this->_timeQuartile1 = dVar11;
  this->_timeQuartile3 = dVar19;
LAB_0013b0b9:
  operator_delete(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

TestResult(const std::vector<uint64_t>& runTimes,
                   std::size_t iterations)
            :   _runTimes(runTimes),
                _iterations(iterations),
                _timeTotal(0),
                _timeRunMin(std::numeric_limits<uint64_t>::max()),
                _timeRunMax(std::numeric_limits<uint64_t>::min()),
                _timeStdDev(0.0),
                _timeMedian(0.0),
                _timeQuartile1(0.0),
                _timeQuartile3(0.0)
        {
            // Summarize under the assumption of values being accessed more
            // than once.
            std::vector<uint64_t>::iterator runIt = _runTimes.begin();

            while (runIt != _runTimes.end())
            {
                const uint64_t run = *runIt;

                _timeTotal += run;
                if ((runIt == _runTimes.begin()) || (run > _timeRunMax))
                    _timeRunMax = run;
                if ((runIt == _runTimes.begin()) || (run < _timeRunMin))
                    _timeRunMin = run;

                ++runIt;
            }

            // Calculate standard deviation.
            const double mean = RunTimeAverage();
            double accu = 0.0;

            runIt = _runTimes.begin();

            while (runIt != _runTimes.end())
            {
                const uint64_t run = *runIt;
                const double diff = double(run) - mean;
                accu += (diff * diff);

                ++runIt;
            }

            _timeStdDev = std::sqrt(accu / (_runTimes.size() - 1));

            // Calculate quartiles.
            std::vector<uint64_t> sortedRunTimes(_runTimes);
            std::sort(sortedRunTimes.begin(), sortedRunTimes.end());

            const std::size_t sortedSize = sortedRunTimes.size();
            const std::size_t sortedSizeHalf = sortedSize / 2;

            if (sortedSize >= 2)
            {
                const std::size_t quartile = sortedSizeHalf / 2;

                if ((sortedSize % 2) == 0)
                {
                    _timeMedian =
                        (double(sortedRunTimes[sortedSizeHalf - 1]) +
                         double(sortedRunTimes[sortedSizeHalf])) / 2;

                    _timeQuartile1 =
                        double(sortedRunTimes[quartile]);
                    _timeQuartile3 =
                        double(sortedRunTimes[sortedSizeHalf + quartile]);
                }
                else
                {
                    _timeMedian = double(sortedRunTimes[sortedSizeHalf]);

                    _timeQuartile1 =
                        (double(sortedRunTimes[quartile - 1]) +
                         double(sortedRunTimes[quartile])) / 2;
                    _timeQuartile3 = (
                        double(
                            sortedRunTimes[sortedSizeHalf + (quartile - 1)]
                        ) +
                        double(
                            sortedRunTimes[sortedSizeHalf + quartile]
                        )
                    ) / 2;
                }
            }
            else if (sortedSize > 0)
            {
                _timeQuartile1 = double(sortedRunTimes[0]);
                _timeQuartile3 = _timeQuartile1;
            }
        }